

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_image.h
# Opt level: O0

void __thiscall
dlib::image_view<dlib::array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_>_>::image_view
          (image_view<dlib::array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_>_> *this,
          array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *img)

{
  _func_int **pp_Var1;
  float *pfVar2;
  long lVar3;
  _func_int **in_RSI;
  array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *in_RDI;
  
  pp_Var1 = (_func_int **)image_data<float,dlib::memory_manager_stateless_kernel_1<char>>(in_RDI);
  (in_RDI->super_enumerable<float>)._vptr_enumerable = pp_Var1;
  pfVar2 = (float *)width_step<float,dlib::memory_manager_stateless_kernel_1<char>>
                              ((array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *)
                               0x48e2a5);
  in_RDI->data = pfVar2;
  lVar3 = num_rows<float,dlib::memory_manager_stateless_kernel_1<char>>
                    ((array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *)0x48e2ba);
  in_RDI->nc_ = lVar3;
  lVar3 = num_columns<float,dlib::memory_manager_stateless_kernel_1<char>>
                    ((array2d<float,_dlib::memory_manager_stateless_kernel_1<char>_> *)0x48e2cf);
  in_RDI->nr_ = lVar3;
  (in_RDI->pool)._vptr_memory_manager_stateless_kernel_1 = in_RSI;
  return;
}

Assistant:

image_view(
            image_type& img
        ) : 
            _data((char*)image_data(img)), 
            _width_step(width_step(img)),
            _nr(num_rows(img)),
            _nc(num_columns(img)),
            _img(&img) 
        {}